

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

int __thiscall cmake::ActualConfigure(cmake *this)

{
  pointer pcVar1;
  cmState *pcVar2;
  size_t __n;
  size_t sVar3;
  cmFileAPI *__ptr;
  cmMakefile *this_00;
  bool bVar4;
  int iVar5;
  ProjectKind PVar6;
  string *psVar7;
  cmValue cVar8;
  Status SVar9;
  cmValue cVar10;
  cmFileAPI *this_01;
  cmGlobalGenerator *pcVar11;
  pointer __s1;
  pointer pcVar12;
  pointer __p;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string message;
  string message_2;
  string redirectsDir;
  undefined1 local_f0 [24];
  char *local_d8;
  char local_d0 [8];
  char *local_c8;
  size_t local_c0;
  pointer local_b8;
  undefined8 local_b0;
  char *local_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [48];
  _Base_ptr local_60;
  _Alloc_hider local_50;
  undefined8 local_40;
  
  UpdateConversionPathTable(this);
  CleanupCommandsAndMacros(this);
  psVar7 = cmState::GetBinaryDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  pcVar1 = local_f0 + 0x10;
  pcVar12 = (psVar7->_M_dataplus)._M_p;
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,pcVar12,pcVar12 + psVar7->_M_string_length);
  std::__cxx11::string::append((char *)local_f0);
  cmsys::SystemTools::RemoveADirectory((string *)local_f0);
  if ((pointer)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
  }
  iVar5 = DoPreConfigureChecks(this);
  if (iVar5 < 0) {
    return -2;
  }
  if (iVar5 == 0) {
    local_f0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"CMAKE_HOME_DIRECTORY","");
    cVar8.Value = cmState::GetSourceDirectory_abi_cxx11_
                            ((this->State)._M_t.
                             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    AddCacheEntry(this,(string *)local_f0,cVar8,
                  "Source directory with the top level CMakeLists.txt file for this project",4);
    if ((pointer)local_f0._0_8_ != pcVar1) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
  }
  psVar7 = cmState::GetBinaryDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  local_f0._8_8_ = (psVar7->_M_dataplus)._M_p;
  local_f0._0_8_ = psVar7->_M_string_length;
  local_f0._16_8_ = 0x18;
  local_d8 = "/CMakeFiles/pkgRedirects";
  views._M_len = 2;
  views._M_array = (iterator)local_f0;
  cmCatViews_abi_cxx11_((string *)&stack0xffffffffffffffb0,views);
  cmsys::SystemTools::RemoveADirectory((string *)&stack0xffffffffffffffb0);
  SVar9 = cmsys::SystemTools::MakeDirectory((string *)&stack0xffffffffffffffb0,(mode_t *)0x0);
  if (SVar9.Kind_ == Success) {
    local_f0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"CMAKE_FIND_PACKAGE_REDIRECTS_DIR","");
    AddCacheEntry(this,(string *)local_f0,(string *)&stack0xffffffffffffffb0,
                  "Value Computed by CMake.",5);
    if ((pointer)local_f0._0_8_ != pcVar1) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    if ((this->GlobalGenerator)._M_t.
        super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
        super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
        super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl == (cmGlobalGenerator *)0x0)
    {
      pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t
               .super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      local_f0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"CMAKE_GENERATOR","");
      cVar8 = cmState::GetInitializedCacheValue(pcVar2,(string *)local_f0);
      if ((pointer)local_f0._0_8_ != pcVar1) {
        operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
      }
      pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t
               .super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      local_f0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"CMAKE_EXTRA_GENERATOR","")
      ;
      cVar10 = cmState::GetInitializedCacheValue(pcVar2,(string *)local_f0);
      if ((pointer)local_f0._0_8_ != pcVar1) {
        operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
      }
      if (cVar8.Value != (string *)0x0) {
        local_a0._0_8_ = (cmGlobalGenerator *)local_90;
        if (cVar10.Value == (string *)0x0) {
          std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"");
        }
        else {
          pcVar12 = ((cVar10.Value)->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a0,pcVar12,pcVar12 + (cVar10.Value)->_M_string_length);
        }
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                  ((string *)local_f0,cVar8.Value,(string *)local_a0);
        if ((cmGlobalGenerator *)local_a0._0_8_ != (cmGlobalGenerator *)local_90) {
          operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
        }
        CreateGlobalGenerator((cmake *)local_a0,(string *)this,SUB81(local_f0,0));
        pcVar11 = (this->GlobalGenerator)._M_t.
                  super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                  .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
        (this->GlobalGenerator)._M_t.
        super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
        super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
        super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
             (cmGlobalGenerator *)local_a0._0_8_;
        if (pcVar11 != (cmGlobalGenerator *)0x0) {
          (*pcVar11->_vptr_cmGlobalGenerator[1])();
        }
        if ((pointer)local_f0._0_8_ != pcVar1) {
          operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
        }
      }
      pcVar11 = (this->GlobalGenerator)._M_t.
                super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      if (pcVar11 == (cmGlobalGenerator *)0x0) {
        CreateDefaultGlobalGenerator(this);
        if ((this->GlobalGenerator)._M_t.
            super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
            super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
            super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl ==
            (cmGlobalGenerator *)0x0) {
          local_f0._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_f0,"Could not create generator","");
          cmSystemTools::Error((string *)local_f0);
          goto LAB_0018c1c7;
        }
      }
      else {
        cmSystemTools::s_ForceUnixPaths = pcVar11->ForceUnixPaths;
      }
    }
    pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    local_f0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"CMAKE_GENERATOR","");
    cVar8 = cmState::GetInitializedCacheValue(pcVar2,(string *)local_f0);
    if ((pointer)local_f0._0_8_ != pcVar1) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
    if ((cVar8.Value == (string *)0x0) ||
       (pcVar11 = (this->GlobalGenerator)._M_t.
                  super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                  .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
       iVar5 = (*pcVar11->_vptr_cmGlobalGenerator[4])(pcVar11,cVar8.Value), (char)iVar5 != '\0')) {
      pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t
               .super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      local_f0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"CMAKE_GENERATOR","");
      cVar8 = cmState::GetInitializedCacheValue(pcVar2,(string *)local_f0);
      if ((pointer)local_f0._0_8_ != pcVar1) {
        operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
      }
      if (cVar8.Value == (string *)0x0) {
        local_f0._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"CMAKE_GENERATOR","");
        (*((this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->_vptr_cmGlobalGenerator
          [3])(local_a0);
        AddCacheEntry(this,(string *)local_f0,(string *)local_a0,"Name of generator.",4);
        if ((cmGlobalGenerator *)local_a0._0_8_ != (cmGlobalGenerator *)local_90) {
          operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
        }
        if ((pointer)local_f0._0_8_ != pcVar1) {
          operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
        }
        local_f0._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f0,"CMAKE_EXTRA_GENERATOR","");
        cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_
                  ((string *)local_a0,
                   (this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl);
        AddCacheEntry(this,(string *)local_f0,(string *)local_a0,
                      "Name of external makefile project generator.",4);
        if ((cmGlobalGenerator *)local_a0._0_8_ != (cmGlobalGenerator *)local_90) {
          operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
        }
        if ((pointer)local_f0._0_8_ != pcVar1) {
          operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
        }
        pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        local_f0._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f0,"CMAKE_TOOLCHAIN_FILE","");
        cVar8 = cmState::GetInitializedCacheValue(pcVar2,(string *)local_f0);
        if ((pointer)local_f0._0_8_ != pcVar1) {
          operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
        }
        if (cVar8.Value == (string *)0x0) {
          local_f0._8_8_ = (pointer)0x0;
          local_f0._16_8_ = local_f0._16_8_ & 0xffffffffffffff00;
          local_f0._0_8_ = pcVar1;
          bVar4 = cmsys::SystemTools::GetEnv("CMAKE_TOOLCHAIN_FILE",(string *)local_f0);
          if (bVar4 && (pointer)local_f0._8_8_ != (pointer)0x0) {
            local_a0._0_8_ = (cmGlobalGenerator *)local_90;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_a0,"CMAKE_TOOLCHAIN_FILE","");
            AddCacheEntry(this,(string *)local_a0,(string *)local_f0,"The CMake toolchain file",2);
            if ((cmGlobalGenerator *)local_a0._0_8_ != (cmGlobalGenerator *)local_90) {
              operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
            }
          }
          if ((pointer)local_f0._0_8_ != pcVar1) {
            operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
          }
        }
      }
      pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t
               .super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      local_f0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f0,"CMAKE_GENERATOR_INSTANCE","");
      cVar8 = cmState::GetInitializedCacheValue(pcVar2,(string *)local_f0);
      if ((pointer)local_f0._0_8_ != pcVar1) {
        operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
      }
      if (cVar8.Value == (string *)0x0) {
        local_f0._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f0,"CMAKE_GENERATOR_INSTANCE","");
        AddCacheEntry(this,(string *)local_f0,(cmValue)&this->GeneratorInstance,
                      "Generator instance identifier.",4);
        if ((pointer)local_f0._0_8_ != pcVar1) {
          operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
        }
      }
      else if (this->GeneratorInstanceSet == true) {
        __n = (this->GeneratorInstance)._M_string_length;
        sVar3 = (cVar8.Value)->_M_string_length;
        if (__n != sVar3) {
          pcVar11 = (cmGlobalGenerator *)(this->GeneratorInstance)._M_dataplus._M_p;
          pcVar12 = ((cVar8.Value)->_M_dataplus)._M_p;
LAB_0018cdb2:
          local_f0._0_8_ = (pointer)0x1b;
          local_f0._8_8_ = "Error: generator instance: ";
          local_d0[0] = '.';
          local_d0[1] = '\0';
          local_d0[2] = '\0';
          local_d0[3] = '\0';
          local_d0[4] = '\0';
          local_d0[5] = '\0';
          local_d0[6] = '\0';
          local_d0[7] = '\0';
          local_c8 = "\nDoes not match the instance used previously: ";
          local_b0 = 0x67;
          local_a8 = 
          "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
          ;
          views_01._M_len = 5;
          views_01._M_array = (iterator)local_f0;
          local_f0._16_8_ = __n;
          local_d8 = (char *)pcVar11;
          local_c0 = sVar3;
          local_b8 = pcVar12;
          cmCatViews_abi_cxx11_((string *)local_a0,views_01);
          cmSystemTools::Error((string *)local_a0);
          goto LAB_0018ce18;
        }
        if (__n != 0) {
          pcVar12 = ((cVar8.Value)->_M_dataplus)._M_p;
          pcVar11 = (cmGlobalGenerator *)(this->GeneratorInstance)._M_dataplus._M_p;
          iVar5 = bcmp(pcVar11,pcVar12,__n);
          if (iVar5 != 0) goto LAB_0018cdb2;
        }
      }
      pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t
               .super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      local_f0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f0,"CMAKE_GENERATOR_PLATFORM","");
      cVar8 = cmState::GetInitializedCacheValue(pcVar2,(string *)local_f0);
      if ((pointer)local_f0._0_8_ != pcVar1) {
        operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
      }
      if (cVar8.Value == (string *)0x0) {
        local_f0._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f0,"CMAKE_GENERATOR_PLATFORM","");
        AddCacheEntry(this,(string *)local_f0,(cmValue)&this->GeneratorPlatform,
                      "Name of generator platform.",4);
        if ((pointer)local_f0._0_8_ != pcVar1) {
          operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
        }
LAB_0018c8ee:
        pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        local_f0._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f0,"CMAKE_GENERATOR_TOOLSET","");
        cVar8 = cmState::GetInitializedCacheValue(pcVar2,(string *)local_f0);
        if ((pointer)local_f0._0_8_ != pcVar1) {
          operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
        }
        if (cVar8.Value == (string *)0x0) {
          local_f0._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_f0,"CMAKE_GENERATOR_TOOLSET","");
          AddCacheEntry(this,(string *)local_f0,(cmValue)&this->GeneratorToolset,
                        "Name of generator toolset.",4);
          if ((pointer)local_f0._0_8_ != pcVar1) {
            operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
          }
        }
        else if ((this->GeneratorToolsetSet == true) &&
                (bVar4 = std::operator!=(&this->GeneratorToolset,cVar8.Value), bVar4)) {
          local_f0._0_8_ = (pointer)0x1a;
          local_f0._8_8_ = "Error: generator toolset: ";
          local_a0._8_8_ = (this->GeneratorToolset)._M_dataplus._M_p;
          local_a0._0_8_ = (this->GeneratorToolset)._M_string_length;
          cmStrCat<char[46],std::__cxx11::string,char[104]>
                    ((string *)(local_90 + 0x20),(cmAlphaNum *)local_f0,(cmAlphaNum *)local_a0,
                     (char (*) [46])"\nDoes not match the toolset used previously: ",cVar8.Value,
                     (char (*) [104])
                     "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                    );
          cmSystemTools::Error((string *)(local_90 + 0x20));
          goto LAB_0018ce82;
        }
        PVar6 = cmState::GetProjectKind
                          ((this->State)._M_t.
                           super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                           super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
        if (PVar6 != TryCompile) {
          cmGlobalGenerator::ClearEnabledLanguages
                    ((this->GlobalGenerator)._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl);
          TruncateOutputLog(this,"CMakeOutput.log");
          TruncateOutputLog(this,"CMakeError.log");
        }
        this_01 = (cmFileAPI *)operator_new(0x108);
        cmFileAPI::cmFileAPI(this_01,this);
        local_f0._0_8_ = (cmFileAPI *)0x0;
        __ptr = (this->FileAPI)._M_t.
                super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>._M_t.
                super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
                super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl;
        (this->FileAPI)._M_t.super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>._M_t.
        super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
        super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl = this_01;
        if ((__ptr != (cmFileAPI *)0x0) &&
           (std::default_delete<cmFileAPI>::operator()
                      ((default_delete<cmFileAPI> *)&this->FileAPI,__ptr),
           (cmFileAPI *)local_f0._0_8_ != (cmFileAPI *)0x0)) {
          std::default_delete<cmFileAPI>::operator()
                    ((default_delete<cmFileAPI> *)local_f0,(cmFileAPI *)local_f0._0_8_);
        }
        cmFileAPI::ReadQueries
                  ((this->FileAPI)._M_t.
                   super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>._M_t.
                   super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
                   super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl);
        (*((this->GlobalGenerator)._M_t.
           super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
           super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
           super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->_vptr_cmGlobalGenerator
          [0xc])();
        pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        local_f0._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f0,"CMAKE_BACKWARDS_COMPATIBILITY","");
        cVar8 = cmState::GetInitializedCacheValue(pcVar2,(string *)local_f0);
        if ((pointer)local_f0._0_8_ != pcVar1) {
          operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
        }
        if (cVar8.Value != (string *)0x0) {
          pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          local_f0._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_f0,"LIBRARY_OUTPUT_PATH","");
          cVar8 = cmState::GetInitializedCacheValue(pcVar2,(string *)local_f0);
          if ((pointer)local_f0._0_8_ != pcVar1) {
            operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
          }
          if (cVar8.Value == (string *)0x0) {
            local_f0._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f0,"LIBRARY_OUTPUT_PATH","");
            AddCacheEntry(this,(string *)local_f0,"",
                          "Single output directory for building all libraries.",1);
            if ((pointer)local_f0._0_8_ != pcVar1) {
              operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
            }
          }
          pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          local_f0._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_f0,"EXECUTABLE_OUTPUT_PATH","");
          cVar8 = cmState::GetInitializedCacheValue(pcVar2,(string *)local_f0);
          if ((pointer)local_f0._0_8_ != pcVar1) {
            operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
          }
          if (cVar8.Value == (string *)0x0) {
            local_f0._0_8_ = pcVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f0,"EXECUTABLE_OUTPUT_PATH","");
            AddCacheEntry(this,(string *)local_f0,"",
                          "Single output directory for building all executables.",1);
            if ((pointer)local_f0._0_8_ != pcVar1) {
              operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
            }
          }
        }
        this_00 = (cmMakefile *)
                  **(undefined8 **)
                    &(((this->GlobalGenerator)._M_t.
                       super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                       .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->Makefiles).
                     super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                     ._M_impl;
        local_f0._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"CTEST_USE_LAUNCHERS","")
        ;
        bVar4 = cmMakefile::IsOn(this_00,(string *)local_f0);
        if (bVar4) {
          pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          local_a0._0_8_ = (cmGlobalGenerator *)local_90;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_a0,"RULE_LAUNCH_COMPILE","");
          cVar8 = cmState::GetGlobalProperty(pcVar2,(string *)local_a0);
          bVar4 = cVar8.Value == (string *)0x0;
          if ((cmGlobalGenerator *)local_a0._0_8_ != (cmGlobalGenerator *)local_90) {
            operator_delete((void *)local_a0._0_8_,local_90._0_8_ + 1);
          }
        }
        else {
          bVar4 = false;
        }
        if ((pointer)local_f0._0_8_ != pcVar1) {
          operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
        }
        if (bVar4) {
          local_f0._0_8_ = pcVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_f0,
                     "CTEST_USE_LAUNCHERS is enabled, but the RULE_LAUNCH_COMPILE global property is not defined.\nDid you forget to include(CTest) in the toplevel CMakeLists.txt ?"
                     ,"");
          cmSystemTools::Error((string *)local_f0);
          if ((pointer)local_f0._0_8_ != pcVar1) {
            operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
          }
        }
        pcVar2 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                 _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
        psVar7 = cmState::GetBinaryDirectory_abi_cxx11_(pcVar2);
        cmState::SaveVerificationScript
                  (pcVar2,psVar7,
                   (this->Messenger)._M_t.
                   super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                   super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                   super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl);
        psVar7 = cmState::GetBinaryDirectory_abi_cxx11_
                           ((this->State)._M_t.
                            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                            super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
        SaveCache(this,psVar7);
        if ((cmSystemTools::s_ErrorOccurred == false) &&
           (cmSystemTools::s_FatalErrorOccurred == false)) {
          bVar4 = cmSystemTools::GetInterruptFlag();
          iVar5 = 0;
          if (!bVar4) goto LAB_0018cea8;
        }
        goto LAB_0018c1de;
      }
      if (this->GeneratorPlatformSet != true) goto LAB_0018c8ee;
      pcVar11 = (cmGlobalGenerator *)(this->GeneratorPlatform)._M_string_length;
      if (pcVar11 == (cmGlobalGenerator *)(cVar8.Value)->_M_string_length) {
        if (pcVar11 != (cmGlobalGenerator *)0x0) {
          __s1 = (pointer)(this->GeneratorPlatform)._M_dataplus._M_p;
          iVar5 = bcmp(__s1,((cVar8.Value)->_M_dataplus)._M_p,(size_t)pcVar11);
          if (iVar5 != 0) goto LAB_0018ce34;
        }
        goto LAB_0018c8ee;
      }
      __s1 = (pointer)(this->GeneratorPlatform)._M_dataplus._M_p;
LAB_0018ce34:
      local_f0._0_8_ = (pointer)0x1b;
      local_f0._8_8_ = "Error: generator platform: ";
      local_a0._0_8_ = pcVar11;
      local_a0._8_8_ = __s1;
      cmStrCat<char[47],std::__cxx11::string,char[104]>
                ((string *)(local_90 + 0x20),(cmAlphaNum *)local_f0,(cmAlphaNum *)local_a0,
                 (char (*) [47])"\nDoes not match the platform used previously: ",cVar8.Value,
                 (char (*) [104])
                 "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                );
      cmSystemTools::Error((string *)(local_90 + 0x20));
LAB_0018ce82:
      local_90._0_8_ = local_60;
      if ((cmGlobalGenerator *)local_90._32_8_ != (cmGlobalGenerator *)&stack0xffffffffffffffa0)
      goto LAB_0018ce9b;
    }
    else {
      (*((this->GlobalGenerator)._M_t.
         super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
         super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
         super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->_vptr_cmGlobalGenerator[3]
      )(local_90 + 0x20);
      local_f0._0_8_ = (pointer)0x13;
      local_f0._8_8_ = "Error: generator : ";
      local_f0._16_8_ = local_90._40_8_;
      local_d8 = (char *)local_90._32_8_;
      local_d0[0] = '/';
      local_d0[1] = '\0';
      local_d0[2] = '\0';
      local_d0[3] = '\0';
      local_d0[4] = '\0';
      local_d0[5] = '\0';
      local_d0[6] = '\0';
      local_d0[7] = '\0';
      local_c8 = "\nDoes not match the generator used previously: ";
      local_b8 = ((cVar8.Value)->_M_dataplus)._M_p;
      local_c0 = (cVar8.Value)->_M_string_length;
      local_b0 = 0x67;
      local_a8 = 
      "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
      ;
      views_00._M_len = 5;
      views_00._M_array = (iterator)local_f0;
      cmCatViews_abi_cxx11_((string *)local_a0,views_00);
      if ((cmGlobalGenerator *)local_90._32_8_ != (cmGlobalGenerator *)&stack0xffffffffffffffa0) {
        operator_delete((void *)local_90._32_8_,(ulong)((long)&local_60->_M_color + 1));
      }
      cmSystemTools::Error((string *)local_a0);
LAB_0018ce18:
      local_90._32_8_ = local_a0._0_8_;
      if ((cmGlobalGenerator *)local_a0._0_8_ != (cmGlobalGenerator *)local_90) {
LAB_0018ce9b:
        operator_delete((void *)local_90._32_8_,
                        (ulong)((long)&((_Base_ptr)local_90._0_8_)->_M_color + 1));
      }
    }
    iVar5 = -2;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                   "Unable to (re)create the private pkgRedirects directory:\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffb0);
    cmSystemTools::Error((string *)local_f0);
LAB_0018c1c7:
    if ((pointer)local_f0._0_8_ != pcVar1) {
      operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
    }
LAB_0018c1de:
    iVar5 = -1;
  }
LAB_0018cea8:
  if (local_50._M_p != (pointer)&stack0xffffffffffffffc0) {
    operator_delete(local_50._M_p,local_40 + 1);
  }
  return iVar5;
}

Assistant:

int cmake::ActualConfigure()
{
  // Construct right now our path conversion table before it's too late:
  this->UpdateConversionPathTable();
  this->CleanupCommandsAndMacros();

  cmSystemTools::RemoveADirectory(this->GetHomeOutputDirectory() +
                                  "/CMakeFiles/CMakeScratch");

  int res = this->DoPreConfigureChecks();
  if (res < 0) {
    return -2;
  }
  if (!res) {
    this->AddCacheEntry(
      "CMAKE_HOME_DIRECTORY", this->GetHomeDirectory(),
      "Source directory with the top level CMakeLists.txt file for this "
      "project",
      cmStateEnums::INTERNAL);
  }

  // We want to create the package redirects directory as early as possible,
  // but not before pre-configure checks have passed. This ensures we get
  // errors about inappropriate source/binary directories first.
  const auto redirectsDir =
    cmStrCat(this->GetHomeOutputDirectory(), "/CMakeFiles/pkgRedirects");
  cmSystemTools::RemoveADirectory(redirectsDir);
  if (!cmSystemTools::MakeDirectory(redirectsDir)) {
    cmSystemTools::Error(
      "Unable to (re)create the private pkgRedirects directory:\n" +
      redirectsDir);
    return -1;
  }
  this->AddCacheEntry("CMAKE_FIND_PACKAGE_REDIRECTS_DIR", redirectsDir,
                      "Value Computed by CMake.", cmStateEnums::STATIC);

  // no generator specified on the command line
  if (!this->GlobalGenerator) {
    cmValue genName = this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
    cmValue extraGenName =
      this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
    if (genName) {
      std::string fullName =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
          *genName, extraGenName ? *extraGenName : "");
      this->GlobalGenerator = this->CreateGlobalGenerator(fullName);
    }
    if (this->GlobalGenerator) {
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(
        this->GlobalGenerator->GetForceUnixPaths());
    } else {
      this->CreateDefaultGlobalGenerator();
    }
    if (!this->GlobalGenerator) {
      cmSystemTools::Error("Could not create generator");
      return -1;
    }
  }

  cmValue genName = this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
  if (genName) {
    if (!this->GlobalGenerator->MatchesGeneratorName(*genName)) {
      std::string message =
        cmStrCat("Error: generator : ", this->GlobalGenerator->GetName(),
                 "\nDoes not match the generator used previously: ", *genName,
                 "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  }
  if (!this->State->GetInitializedCacheValue("CMAKE_GENERATOR")) {
    this->AddCacheEntry("CMAKE_GENERATOR", this->GlobalGenerator->GetName(),
                        "Name of generator.", cmStateEnums::INTERNAL);
    this->AddCacheEntry(
      "CMAKE_EXTRA_GENERATOR", this->GlobalGenerator->GetExtraGeneratorName(),
      "Name of external makefile project generator.", cmStateEnums::INTERNAL);

    if (!this->State->GetInitializedCacheValue("CMAKE_TOOLCHAIN_FILE")) {
      std::string envToolchain;
      if (cmSystemTools::GetEnv("CMAKE_TOOLCHAIN_FILE", envToolchain) &&
          !envToolchain.empty()) {
        this->AddCacheEntry("CMAKE_TOOLCHAIN_FILE", envToolchain,
                            "The CMake toolchain file",
                            cmStateEnums::FILEPATH);
      }
    }
  }

  if (cmValue instance =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_INSTANCE")) {
    if (this->GeneratorInstanceSet && this->GeneratorInstance != *instance) {
      std::string message =
        cmStrCat("Error: generator instance: ", this->GeneratorInstance,
                 "\nDoes not match the instance used previously: ", *instance,
                 "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_INSTANCE", this->GeneratorInstance,
                        "Generator instance identifier.",
                        cmStateEnums::INTERNAL);
  }

  if (cmValue platformName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_PLATFORM")) {
    if (this->GeneratorPlatformSet &&
        this->GeneratorPlatform != *platformName) {
      std::string message = cmStrCat(
        "Error: generator platform: ", this->GeneratorPlatform,
        "\nDoes not match the platform used previously: ", *platformName,
        "\nEither remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_PLATFORM", this->GeneratorPlatform,
                        "Name of generator platform.", cmStateEnums::INTERNAL);
  }

  if (cmValue tsName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_TOOLSET")) {
    if (this->GeneratorToolsetSet && this->GeneratorToolset != *tsName) {
      std::string message =
        cmStrCat("Error: generator toolset: ", this->GeneratorToolset,
                 "\nDoes not match the toolset used previously: ", *tsName,
                 "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_TOOLSET", this->GeneratorToolset,
                        "Name of generator toolset.", cmStateEnums::INTERNAL);
  }

  // reset any system configuration information, except for when we are
  // InTryCompile. With TryCompile the system info is taken from the parent's
  // info to save time
  if (!this->GetIsInTryCompile()) {
    this->GlobalGenerator->ClearEnabledLanguages();

    this->TruncateOutputLog("CMakeOutput.log");
    this->TruncateOutputLog("CMakeError.log");
  }

#if !defined(CMAKE_BOOTSTRAP)
  this->FileAPI = cm::make_unique<cmFileAPI>(this);
  this->FileAPI->ReadQueries();
#endif

  // actually do the configure
  this->GlobalGenerator->Configure();
  // Before saving the cache
  // if the project did not define one of the entries below, add them now
  // so users can edit the values in the cache:

  // We used to always present LIBRARY_OUTPUT_PATH and
  // EXECUTABLE_OUTPUT_PATH.  They are now documented as old-style and
  // should no longer be used.  Therefore we present them only if the
  // project requires compatibility with CMake 2.4.  We detect this
  // here by looking for the old CMAKE_BACKWARDS_COMPATIBILITY
  // variable created when CMP0001 is not set to NEW.
  if (this->State->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY")) {
    if (!this->State->GetInitializedCacheValue("LIBRARY_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "LIBRARY_OUTPUT_PATH", "",
        "Single output directory for building all libraries.",
        cmStateEnums::PATH);
    }
    if (!this->State->GetInitializedCacheValue("EXECUTABLE_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "EXECUTABLE_OUTPUT_PATH", "",
        "Single output directory for building all executables.",
        cmStateEnums::PATH);
    }
  }

  const auto& mf = this->GlobalGenerator->GetMakefiles()[0];
  if (mf->IsOn("CTEST_USE_LAUNCHERS") &&
      !this->State->GetGlobalProperty("RULE_LAUNCH_COMPILE")) {
    cmSystemTools::Error(
      "CTEST_USE_LAUNCHERS is enabled, but the "
      "RULE_LAUNCH_COMPILE global property is not defined.\n"
      "Did you forget to include(CTest) in the toplevel "
      "CMakeLists.txt ?");
  }

  this->State->SaveVerificationScript(this->GetHomeOutputDirectory(),
                                      this->Messenger.get());
  this->SaveCache(this->GetHomeOutputDirectory());
  if (cmSystemTools::GetErrorOccurredFlag()) {
    return -1;
  }
  return 0;
}